

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_string.hpp
# Opt level: O1

char __thiscall dna_string::operator[](dna_string *this,uint64_t i)

{
  int iVar1;
  uint8_t *puVar2;
  char cVar3;
  char cVar4;
  uint uVar5;
  byte bVar6;
  char cVar7;
  uint uVar8;
  char cVar9;
  ulong uVar10;
  char cVar11;
  ulong uVar12;
  uint uVar13;
  
  uVar12 = i >> 1 & 0xffffffff80000000;
  puVar2 = this->data;
  uVar10 = (ulong)((uint)(i >> 1) & 0x7fffffc0);
  bVar6 = ~(byte)i;
  uVar8 = (uint)(*(ulong *)(puVar2 + uVar10 + 0x28 + uVar12) >> (bVar6 & 0x3f));
  if ((bVar6 & 0x40) == 0) {
    uVar8 = (uint)(*(ulong *)(puVar2 + uVar10 + 0x20 + uVar12) >> (bVar6 & 0x3f)) |
            (uint)(*(ulong *)(puVar2 + uVar10 + 0x28 + uVar12) << 0x40 - (bVar6 & 0x3f));
  }
  uVar5 = (uint)(*(ulong *)(puVar2 + uVar10 + 0x18 + uVar12) >> (bVar6 & 0x3f));
  if ((bVar6 & 0x40) == 0) {
    uVar5 = (uint)(*(ulong *)(puVar2 + uVar10 + 0x10 + uVar12) >> (bVar6 & 0x3f)) |
            (uint)(*(ulong *)(puVar2 + uVar10 + 0x18 + uVar12) << 0x40 - (bVar6 & 0x3f));
  }
  uVar13 = (uint)(*(ulong *)(puVar2 + uVar10 + uVar12) >> (bVar6 & 0x3f)) |
           (uint)(*(ulong *)(puVar2 + uVar10 + 8 + uVar12) << 0x40 - (bVar6 & 0x3f));
  if ((bVar6 & 0x40) != 0) {
    uVar13 = (uint)(*(ulong *)(puVar2 + uVar10 + 8 + uVar12) >> (bVar6 & 0x3f));
  }
  iVar1 = (uVar13 & 1) + (uVar5 & 1) * 2 + (uVar8 & 1) * 4;
  cVar7 = '\0';
  cVar3 = 'A';
  if (iVar1 != 0) {
    cVar3 = '\0';
  }
  cVar9 = 'C';
  if (iVar1 != 1) {
    cVar9 = '\0';
  }
  cVar11 = 'G';
  if (iVar1 != 2) {
    cVar11 = '\0';
  }
  cVar4 = 'T';
  if (iVar1 != 3) {
    cVar4 = '\0';
  }
  if (iVar1 == 4) {
    cVar7 = (char)*(undefined4 *)this;
  }
  return cVar4 + cVar11 + cVar9 + cVar3 + cVar7;
}

Assistant:

char operator[](uint64_t i){

		assert(i<n);

		uint64_t superblock_number = i / SUPERBLOCK_SIZE;
		uint64_t superblock_off = i % SUPERBLOCK_SIZE;
		uint64_t block_number = superblock_off / BLOCK_SIZE;
		uint64_t block_off = superblock_off % BLOCK_SIZE;

		//chars[0..3] contains 1st, 2nd, 3rd least significant bits of the BLOCK_SIZE characters
		__uint128_t* chars = (__uint128_t*)(data + superblock_number*BYTES_PER_SUPERBLOCK + block_number*BYTES_PER_BLOCK);

		uint64_t b =	((chars[0]>>(BLOCK_SIZE-(block_off+1)))&0x1) +
						(((chars[1]>>(BLOCK_SIZE-(block_off+1)))&0x1)<<1) +
						(((chars[2]>>(BLOCK_SIZE-(block_off+1)))&0x1)<<2);

		return 	(b == 0)*'A' +
				(b == 1)*'C' +
				(b == 2)*'G' +
				(b == 3)*'T' +
				(b == 4)*TERM;

	}